

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapValueRef::SetDoubleValue(MapValueRef *this,double value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage local_20;
  
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  if (CVar1 == CPPTYPE_DOUBLE) {
    *(double *)(this->super_MapValueConstRef).data_ = value;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.h"
             ,0x2ff);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_20,(char (*) [34])"Protocol Buffer map usage error:\n");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [28])"MapValueRef::SetDoubleValue");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [22])" type does not match\n");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Expected : ");
  sVar3 = FieldDescriptor::CppTypeName(CPPTYPE_DOUBLE);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x34be96);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Actual   : ");
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  sVar3 = FieldDescriptor::CppTypeName(CVar1);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void SetDoubleValue(double value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_DOUBLE, "MapValueRef::SetDoubleValue");
    *reinterpret_cast<double*>(data_) = value;
  }